

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

float If_CutAverageRefs(If_Man_t *p,If_Cut_t *pCut)

{
  bool bVar1;
  int local_28;
  int local_24;
  int i;
  int nRefsTotal;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  local_24 = 0;
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if (local_28 < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      _i = If_ManObj(p,(int)(&pCut[1].Area)[local_28]);
      bVar1 = _i != (If_Obj_t *)0x0;
    }
    if (!bVar1) break;
    local_24 = _i->nRefs + local_24;
    local_28 = local_28 + 1;
  }
  return (float)local_24 / (float)(*(uint *)&pCut->field_0x1c >> 0x18);
}

Assistant:

float If_CutAverageRefs( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    int nRefsTotal, i;
    nRefsTotal = 0;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        nRefsTotal += pLeaf->nRefs;
    return ((float)nRefsTotal)/pCut->nLeaves;
}